

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O2

void walk_stack(StackWord *start68k)

{
  StackWord *SAddr;
  ushort uVar1;
  bool bVar2;
  DLword DVar3;
  DLword DVar4;
  StackWord SVar5;
  LispPTR LVar6;
  LispPTR LVar7;
  uint uVar8;
  LispPTR *pLVar9;
  StackWord *pSVar10;
  FX *fx;
  StackWord *pSVar11;
  ulong uVar12;
  char *pcVar13;
  StackWord *pSVar14;
  DLword local_42;
  undefined2 local_40;
  undefined2 local_3e;
  
  DVar4 = MachineState.pvar[-5];
  DVar3 = StackOffsetFromNative(MachineState.csp);
  if ((DVar4 == DVar3) && (MachineState.csp[1] == 0xa000)) {
    bVar2 = true;
  }
  else {
    if (MachineState.csp <= MachineState.pvar + -10) {
      warn("CURRENTFX >= CurrentStackPTR??\n");
      LVar7 = LAddrFromNative(MachineState.pvar + -10);
      LVar6 = LAddrFromNative(MachineState.csp);
      printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n",(ulong)LVar7,(ulong)LVar6);
    }
    puts("set CURRENTFX->nextblock in debugger. But it will be reset after this check ");
    local_42 = MachineState.pvar[-5];
    local_40 = *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2);
    local_3e = *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2);
    DVar4 = StackOffsetFromNative(MachineState.csp + 2);
    MachineState.pvar[-5] = DVar4;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 3) ^ 2) =
         (short)(((int)MachineState.endofstack - (int)MachineState.csp) - 4U >> 1);
    bVar2 = false;
  }
  if (start68k == (StackWord *)0x0) {
    uVar12 = (ulong)InterfacePage->stackbase;
    pSVar11 = (StackWord *)(Stackspace + uVar12);
    pcVar13 = "Stack base = 0x%tx.";
  }
  else {
    pSVar11 = (StackWord *)((ulong)start68k & 0xfffffffffffffffe);
    uVar12 = (long)pSVar11 - (long)Stackspace >> 1;
    pcVar13 = "Starting at 0x%tx.";
  }
  printf(pcVar13,uVar12);
  pSVar14 = (StackWord *)((ulong)((uint)InterfacePage->endofstack * 2) + (long)Stackspace);
  printf("  End of stack = 0x%tx.\n\n");
  if (*(ushort *)((ulong)pSVar14 ^ 2) >> 0xd != 7) {
    printf("?? endstack is not GUARD BLK\nendstack = %p, flags = %d\n\n",pSVar14);
  }
  do {
    if (pSVar14 <= pSVar11) {
      puts("\nStack Check done");
      if (!bVar2) {
        MachineState.pvar[-5] = local_42;
        *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = local_40;
        *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2) = local_3e;
      }
      return;
    }
    uVar1 = *(ushort *)((ulong)pSVar11 ^ 2) >> 0xd;
    if (uVar1 == 5) {
      SVar5 = *pSVar11;
      pcVar13 = "%04tx:  Free block (len %d/0x%x)\n";
LAB_00126016:
      uVar12 = (ulong)(ushort)SVar5;
      printf(pcVar13,(long)pSVar11 - (long)Stackspace >> 1,uVar12,uVar12);
      if (SVar5 == (StackWord)0x0) {
        uVar12 = 2;
      }
      pSVar11 = pSVar11 + uVar12;
    }
    else {
      if (uVar1 != 6) {
        if (uVar1 != 7) {
          do {
            if (0x1fff < *(ushort *)((ulong)pSVar11 ^ 2)) {
              printf("%04tx:  Bad BF IVAR 0x%x\n",(long)pSVar11 - (long)Stackspace >> 1);
            }
            pSVar11 = pSVar11 + 2;
          } while( true );
        }
        SVar5 = *pSVar11;
        pcVar13 = "%04tx:  Guard block (len %d/0x%x)\n";
        goto LAB_00126016;
      }
      printf("%04tx:  ",(long)pSVar11 - (long)Stackspace >> 1);
      pLVar9 = NativeAligned4FromLAddr(*(LispPTR *)(pSVar11 + 2));
      print(pLVar9[2] & 0xfffffff);
      printf("\talink: 0x%04x, clink: 0x%04x, next: 0x%04x\n",(ulong)(ushort)*pSVar11,
             (ulong)(ushort)pSVar11[8],(ulong)(ushort)pSVar11[5]);
      SAddr = pSVar11 + -2;
      DVar4 = StackOffsetFromNative(SAddr);
      if (((ushort)*pSVar11 & 1) == 0) {
        LVar7 = LAddrFromNative(SAddr);
        uVar8 = LVar7 & 0xffff;
      }
      else {
        uVar8 = (uint)(ushort)pSVar11[9];
      }
      if (uVar8 != DVar4) {
        if (((ushort)*pSVar11 & 1) == 0) {
          LVar7 = LAddrFromNative(SAddr);
          SVar5 = SUB42(LVar7,0);
        }
        else {
          SVar5 = pSVar11[9];
        }
        pSVar10 = (StackWord *)NativeAligned4FromStackOffset((DLword)SVar5);
        if (((pSVar11[-1].field_0x1 & 2) == 0) || (*SAddr != *pSVar10)) {
          puts("       [Bad residual]");
        }
      }
      pSVar11 = (StackWord *)((ulong)((uint)(ushort)pSVar11[5] * 2) + (long)Stackspace);
    }
    if ((pSVar11 != start68k) && (pSVar14 < pSVar11)) {
      warn("scanptr exceeded end stack");
      printf("scanptr68k=%p endstack68k=%p",pSVar11,pSVar14);
    }
  } while( true );
}

Assistant:

void walk_stack(StackWord *start68k) {
  StackWord *scanptr68k;
  StackWord *endstack68k;
  DLword *top_ivar;
  DLword save_nextblock;
  DLword savestack1, savestack2;
  DLword setflg = NIL;
  DLword freesize;

  if ((CURRENTFX->nextblock != StackOffsetFromNative(CurrentStackPTR)) || (!FSBP(CurrentStackPTR))) {
    if ((DLword *)CURRENTFX >= CurrentStackPTR) {
      WARN("CURRENTFX >= CurrentStackPTR??\n",
           printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n", LAddrFromNative(CURRENTFX),
                  LAddrFromNative(CurrentStackPTR)));
    }
    setflg = T;
    printf("set CURRENTFX->nextblock in debugger. But it will be reset after this check \n");
    save_nextblock = CURRENTFX->nextblock;
    savestack1 = GETWORD(CurrentStackPTR + 2);
    savestack2 = GETWORD(CurrentStackPTR + 3);
    CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR + 2);
    GETWORD(CurrentStackPTR + 2) = STK_FSB_WORD;
    GETWORD(CurrentStackPTR + 3) = (((UNSIGNED)EndSTKP - (UNSIGNED)(CurrentStackPTR + 2)) >> 1);
  }

  /* Start from where caller specifies, (as real address!); if addr=0 */
  /* start from stackbase. */

  if (start68k) {
    scanptr68k = (StackWord *)((unsigned long)start68k & -2);
    printf("Starting at 0x%tx.", (DLword *)scanptr68k - Stackspace);
  } else {
    scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
    printf("Stack base = 0x%tx.", (DLword *)scanptr68k - Stackspace);
  }

  endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);

  printf("  End of stack = 0x%tx.\n\n", (DLword *)endstack68k - Stackspace);

  if (STKWORD(endstack68k)->flags != STK_GUARD)
    printf("?? endstack is not GUARD BLK\nendstack = %p, flags = %d\n\n", (void *)endstack68k,
           STKWORD(endstack68k)->flags);

  while (scanptr68k < endstack68k) {
    switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
      /* Free stack block */
      case STK_FSB:
        freesize = FSB_size(scanptr68k);
        printf("%04tx:  Free block (len %d/0x%x)\n", (DLword *)scanptr68k - Stackspace, freesize,
               freesize);

        if (freesize == 0) { freesize = 2; }

        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);

        break;

      case STK_GUARD:
        freesize = FSB_size(scanptr68k);
        printf("%04tx:  Guard block (len %d/0x%x)\n", (DLword *)scanptr68k - Stackspace, freesize,
               freesize);
        if (freesize == 0) { freesize = 2; }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);

        break;

      case STK_FX:
        CHECK_FX((FX *)scanptr68k);

        printf("%04tx:  ", (DLword *)scanptr68k - Stackspace);

        {
          FX *fx = (FX *)scanptr68k;
          struct fnhead *fnobj;
#ifdef BIGVM
          fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
          fnobj =
              (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
          print(fnobj->framename);
          printf("\talink: 0x%04x, clink: 0x%04x, next: 0x%04x\n", fx->alink, fx->clink,
                 fx->nextblock);
        }

        {
          Bframe *dummybf, *mtmp;
          int mblink;

          /* Now make sure the FX is connected to */
          /* a Basic Frame.                       */

          dummybf = (Bframe *)DUMMYBF(scanptr68k);

          /* Check for connection via BLINK field: */
          if (StackOffsetFromNative(dummybf) != GETBLINK(scanptr68k)) {
            mblink = GETBLINK(scanptr68k);
            mtmp = (Bframe *)NativeAligned4FromStackOffset(mblink);
            if ((dummybf->residual == NIL) || (dummybf->ivar != mtmp->ivar))
              printf("       [Bad residual]\n");
          }
        }

        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
        break;

      default:
        top_ivar = (DLword *)scanptr68k;
        while (STKWORD(scanptr68k)->flags != STK_BF) {
          if (STKWORD(scanptr68k)->flags != STK_NOTFLG) {
            printf("%04tx:  Bad BF IVAR 0x%x\n", (DLword *)scanptr68k - Stackspace,
                   GETWORD((DLword *)scanptr68k));
          }
          scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        } /* while end */
        /* CHECK_BF(scanptr68k); */
        {
          Bframe *bf = (Bframe *)scanptr68k;
          printf("%04tx:  BF  usecnt %d, resid %d, padding %d, ivar 0x%04x\n",
                 (DLword *)scanptr68k - Stackspace, bf->usecnt, bf->residual, bf->padding,
                 bf->ivar);

          if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(top_ivar))
            printf("       [but top_ivar = 0x%04tx]\n", top_ivar - Stackspace);
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        break;

    } /*switch end */

    if (scanptr68k != start68k) {
      if (scanptr68k > endstack68k) {
        WARN("scanptr exceeded end stack",
             printf("scanptr68k=%p endstack68k=%p", (void *)scanptr68k, (void *)endstack68k));
      }
    }
  } /* while end */

#ifdef FSBCHECK
  if (bigFSBindex != 0) {
    int i;

    printf("\nBIG FSB(s):\n");

    for (i = 0; i < bigFSBindex; i++) {
      printf("Offset: 0x%x , Size: 0x%x\n", bigFSB[i].offset, bigFSB[i].size);
    }
  }
#endif
  printf("\nStack Check done\n");
  if (setflg) {
    CURRENTFX->nextblock = save_nextblock;
    GETWORD(CurrentStackPTR + 2) = savestack1;
    GETWORD(CurrentStackPTR + 3) = savestack2;
  }

}